

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestCase * __thiscall testing::UnitTest::current_test_case(UnitTest *this)

{
  TestCase *pTVar1;
  long in_FS_OFFSET;
  MutexLock lock;
  GTestMutexLock local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.mutex_ = &(this->mutex_).super_MutexBase;
  internal::MutexBase::Lock(local_20.mutex_);
  pTVar1 = this->impl_->current_test_case_;
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pTVar1;
  }
  __stack_chk_fail();
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_case();
}